

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xgemm.c
# Opt level: O0

void xb_sgemm(char *transa,char *transb,int *M,int *N,int *K,float *alpha,float *a,int *p_lda,
             float *b,int *p_ldb,float *beta,float *c,int *p_ldc)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  int *in_RCX;
  int *in_RDX;
  char *in_RSI;
  char *in_RDI;
  int *in_R8;
  float *in_R9;
  int ci;
  int bj;
  int ai;
  int h;
  int j;
  int i;
  float local_bc;
  char order;
  float tmp2;
  float tmp1;
  float sum;
  float prod;
  float c_elem;
  float b_elem;
  float a_elem;
  int ldc;
  int ldb;
  int lda;
  int k;
  int n;
  int m;
  float beta_i;
  float alpha_i;
  float *c_i;
  float *b_i;
  float *a_i;
  int inccij;
  int incci;
  int incbhj;
  int incbj;
  int incaih;
  int incai;
  int cij;
  int bhj;
  int aih;
  
  fVar1 = *in_R9;
  fVar2 = (float)*N;
  iVar3 = *in_RDX;
  iVar4 = *in_RCX;
  iVar5 = *in_R8;
  iVar6 = *_j;
  fVar7 = (float)*K;
  iVar8 = *(int *)transb;
  if ((((0 < iVar3) && (0 < iVar4)) && (0 < iVar5)) && (iVar3 <= iVar8)) {
    iVar9 = iVar3;
    if ((*in_RDI != 'n') && (*in_RDI != 'N')) {
      iVar9 = iVar5;
    }
    if (iVar9 <= iVar6) {
      iVar9 = iVar5;
      if ((*in_RSI != 'n') && (*in_RSI != 'N')) {
        iVar9 = iVar4;
      }
      if ((iVar9 <= (int)fVar7) &&
         ((((fVar1 != 0.0 || (NAN(fVar1))) || (fVar2 != 1.0)) || (NAN(fVar2))))) {
        if ((*in_RDI == 'n') || (*in_RDI == 'N')) {
          lda = 1;
          ldb = iVar6;
        }
        else {
          ldb = 1;
          lda = iVar6;
        }
        if ((*in_RSI == 'n') || (*in_RSI == 'N')) {
          a_elem = 1.4013e-45;
          ldc = (int)fVar7;
        }
        else {
          ldc = 1;
          a_elem = fVar7;
        }
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          if ((fVar1 != 1.0) || (NAN(fVar1))) {
            beta_i = 0.0;
            c_i._0_4_ = 0;
            for (b_i._4_4_ = 0; b_i._4_4_ < iVar3; b_i._4_4_ = b_i._4_4_ + 1) {
              k = (int)beta_i;
              alpha_i = 0.0;
              for (b_i._0_4_ = 0; (int)b_i < iVar4; b_i._0_4_ = (int)b_i + 1) {
                m = (int)c_i;
                n = (int)alpha_i;
                local_bc = 0.0;
                for (c_i._4_4_ = 0; c_i._4_4_ < iVar5; c_i._4_4_ = c_i._4_4_ + 1) {
                  local_bc = local_bc + *(float *)(_ai + (long)m * 4) * alpha[n];
                  m = ldb + m;
                  n = (int)a_elem + n;
                }
                M[k] = (int)(local_bc * fVar1 + (float)M[k] * fVar2);
                k = iVar8 + k;
                alpha_i = (float)(ldc + (int)alpha_i);
              }
              beta_i = (float)((int)beta_i + 1);
              c_i._0_4_ = lda + (int)c_i;
            }
          }
          else if ((fVar2 != 0.0) || (NAN(fVar2))) {
            beta_i = 0.0;
            c_i._0_4_ = 0;
            for (b_i._4_4_ = 0; b_i._4_4_ < iVar3; b_i._4_4_ = b_i._4_4_ + 1) {
              k = (int)beta_i;
              alpha_i = 0.0;
              for (b_i._0_4_ = 0; (int)b_i < iVar4; b_i._0_4_ = (int)b_i + 1) {
                m = (int)c_i;
                n = (int)alpha_i;
                local_bc = 0.0;
                for (c_i._4_4_ = 0; c_i._4_4_ < iVar5; c_i._4_4_ = c_i._4_4_ + 1) {
                  local_bc = local_bc + *(float *)(_ai + (long)m * 4) * alpha[n];
                  m = ldb + m;
                  n = (int)a_elem + n;
                }
                M[k] = (int)((float)M[k] * fVar2 + local_bc);
                k = iVar8 + k;
                alpha_i = (float)(ldc + (int)alpha_i);
              }
              beta_i = (float)((int)beta_i + 1);
              c_i._0_4_ = lda + (int)c_i;
            }
          }
          else {
            beta_i = 0.0;
            c_i._0_4_ = 0;
            for (b_i._4_4_ = 0; b_i._4_4_ < iVar3; b_i._4_4_ = b_i._4_4_ + 1) {
              k = (int)beta_i;
              alpha_i = 0.0;
              for (b_i._0_4_ = 0; (int)b_i < iVar4; b_i._0_4_ = (int)b_i + 1) {
                m = (int)c_i;
                n = (int)alpha_i;
                local_bc = 0.0;
                for (c_i._4_4_ = 0; c_i._4_4_ < iVar5; c_i._4_4_ = c_i._4_4_ + 1) {
                  local_bc = local_bc + *(float *)(_ai + (long)m * 4) * alpha[n];
                  m = ldb + m;
                  n = (int)a_elem + n;
                }
                M[k] = (int)local_bc;
                k = iVar8 + k;
                alpha_i = (float)(ldc + (int)alpha_i);
              }
              beta_i = (float)((int)beta_i + 1);
              c_i._0_4_ = lda + (int)c_i;
            }
          }
        }
        else {
          beta_i = 0.0;
          for (b_i._4_4_ = 0; b_i._4_4_ < iVar3; b_i._4_4_ = b_i._4_4_ + 1) {
            k = (int)beta_i;
            for (b_i._0_4_ = 0; (int)b_i < iVar4; b_i._0_4_ = (int)b_i + 1) {
              M[k] = (int)((float)M[k] * fVar2);
              k = iVar8 + k;
            }
            beta_i = (float)((int)beta_i + 1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
xb_sgemm (char *transa, char *transb, int *M, int *N, int *K,
	  float *alpha, const float *a, int *p_lda, const float *b, 
	  int *p_ldb, float *beta, float *c, int *p_ldc)
/* 
 * Purpose
 * =======
 *
 * This routine computes the matrix product:
 *
 *      C   <-  alpha * op(A) * op(B)  +  beta * C .
 * 
 * where op(M) represents either M, M transpose, 
 * or M conjugate transpose.
 *
 * Arguments
 * =========
 *
 * order   (input) enum blas_order_type
 *         Storage  of input matrices A, B, and C.
 *
 * transa  (input) enum blas_trans_type
 *         Operation to be done on matrix A before multiplication.
 *         Can be no operation, transposition, or conjugate transposition.
 *
 * transb  (input) enum blas_trans_type
 *         Operation to be done on matrix B before multiplication.
 *         Can be no operation, transposition, or conjugate transposition.
 * 
 * m n k   (input) int
 *         The dimensions of matrices A, B, and C.
 *         Matrix C is m-by-n matrix.
 *         Matrix A is m-by-k if A is not transposed, 
 *                     k-by-m otherwise.
 *         Matrix B is k-by-n if B is not transposed, 
 *                     n-by-k otherwise.
 *      
 * alpha   (input) float
 *
 * a       (input) const float*
 *         matrix A.
 * 
 * lda     (input) int
 *         leading dimension of A.
 * 
 * b       (input) const float*
 *         matrix B
 *
 * ldb     (input) int
 *         leading dimension of B.
 *
 * beta    (input) float
 *
 * c       (input/output) float*
 *         matrix C
 *
 * ldc     (input) int
 *         leading dimension of C.
 *
 */
{


    /* Integer Index Variables */
    int i, j, h;

    int ai, bj, ci;
    int aih, bhj, cij;		/* Index into matrices a, b, c during multiply */

    int incai, incaih;		/* Index increments for matrix a */
    int incbj, incbhj;		/* Index increments for matrix b */
    int incci, inccij;		/* Index increments for matrix c */

    /* Input Matrices */
    const float *a_i = a;
    const float *b_i = b;

    /* Output Matrix */
    float *c_i = c;

    /* Input Scalars */
    float alpha_i = *alpha;
    float beta_i = *beta;
    int m=*M, n=*N, k=*K;
    int lda=*p_lda, ldb=*p_ldb, ldc=*p_ldc;

    /* Temporary Floating-Point Variables */
    float a_elem;
    float b_elem;
    float c_elem;
    float prod;
    float sum;
    float tmp1;
    float tmp2;

    char order = COLMAJOR; /* For the time being, it is always COLMAJOR.
			      Eventually, it might change. */

#if MDEBUG
    const float *A = a, *B =b, *C = c, *C1 = c;
    printf("In Sgemm\n");
    printf("m=%d, n=%d, k=%d\n", m, n, k);
    printf("alpha=%f, beta=%f\n", alpha_i, beta_i);
    printf("\n");	  
    /* for(i=0; i<m*k; i++)  printf("%.1f ", *A++); printf("\n\n"); */
    /* for(i=0; i<n*k; i++)  printf("%.1f ", *B++); printf("\n\n"); */
    /* for(i=0; i<n*k; i++)  printf("%.1f ", *C++); printf("\n"); */
#endif
    
    /* Test for error conditions */
    if (m <= 0 || n <= 0 || k <= 0)
    {
	return;
    }

    if (order == COLMAJOR)
    {

	if (ldc < m)
	    return;

	if (*transa == 'n' || *transa == 'N')
	{
	    if (lda < m)
		return;
	}
	else
	{
	    if (lda < k)
		return;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    if (ldb < k)
		return;
	}
	else
	{
	    if (ldb < n)
		return;
	}

    }
    else
    {
	/* row major */
	if (ldc < n)
	    return;

	if (*transa == 'n' || *transa == 'N')
	{
	    if (lda < k)
		return;
	}
	else
	{
	    if (lda < m)
		return;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    if (ldb < n)
		return;
	}
	else
	{
	    if (ldb < k)
		return;
	}
    }

    /* Test for no-op */
    if (alpha_i == 0.0 && beta_i == 1.0)
    {
	return;
    }

    /* Set Index Parameters */
    if (order == COLMAJOR)
    {
	incci = 1;
	inccij = ldc;

	if (*transa == 'n' || *transa == 'N')
	{
	    incai = 1;
	    incaih = lda;
	}
	else
	{
	    incai = lda;
	    incaih = 1;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    incbj = ldb;
	    incbhj = 1;
	}
	else
	{
	    incbj = 1;
	    incbhj = ldb;
	}

    }
    else
    {
	/* row major */
	incci = ldc;
	inccij = 1;

	if (*transa == 'n' || *transa == 'N')
	{
	    incai = lda;
	    incaih = 1;
	}
	else
	{
	    incai = 1;
	    incaih = lda;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    incbj = 1;
	    incbhj = ldb;
	}
	else
	{
	    incbj = ldb;
	    incbhj = 1;
	}

    }



    /* Ajustment to increments */







    /* alpha = 0.  In this case, just return beta * C */
    if (alpha_i == 0.0)
    {

	ci = 0;
	for (i = 0; i < m; i++, ci += incci)
	{
	    cij = ci;
	    for (j = 0; j < n; j++, cij += inccij)
	    {
		c_elem = c_i[cij];
		tmp1 = c_elem * beta_i;
		c_i[cij] = tmp1;
	    }
	}

    }
    else if (alpha_i == 1.0)
    {

	/* Case alpha == 1. */

	if (beta_i == 0.0)
	{
	    /* Case alpha == 1, beta == 0.   We compute  C <--- A * B */

	    ci = 0;
	    ai = 0;
	    for (i = 0; i < m; i++, ci += incci, ai += incai)
	    {

		cij = ci;
		bj = 0;

		for (j = 0; j < n; j++, cij += inccij, bj += incbj)
		{

		    aih = ai;
		    bhj = bj;

		    sum = 0.0;

		    for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		    {
			a_elem = a_i[aih];
			b_elem = b_i[bhj];
			prod = a_elem * b_elem;
			sum = sum + prod;
		    }
		    tmp1 = sum;
		    c_i[cij] = tmp1;
		}
	    }

	}
	else
	{
	    /* Case alpha == 1, but beta != 0.
	       We compute   C <--- A * B + beta * C   */

	    ci = 0;
	    ai = 0;
	    for (i = 0; i < m; i++, ci += incci, ai += incai)
	    {

		cij = ci;
		bj = 0;

		for (j = 0; j < n; j++, cij += inccij, bj += incbj)
		{

		    aih = ai;
		    bhj = bj;

		    sum = 0.0;

		    for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		    {
			a_elem = a_i[aih];
			b_elem = b_i[bhj];
			prod = a_elem * b_elem;
			sum = sum + prod;
		    }

		    c_elem = c_i[cij];
		    tmp2 = c_elem * beta_i;
		    tmp1 = sum;
		    tmp1 = tmp2 + tmp1;
		    c_i[cij] = tmp1;
		}
	    }
	}

    }
    else
    {

	/* The most general form,   C <-- alpha * A * B + beta * C  */
	ci = 0;
	ai = 0;
	for (i = 0; i < m; i++, ci += incci, ai += incai)
	{

	    cij = ci;
	    bj = 0;

	    for (j = 0; j < n; j++, cij += inccij, bj += incbj)
	    {

		aih = ai;
		bhj = bj;

		sum = 0.0;

		for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		{
		    a_elem = a_i[aih];
		    b_elem = b_i[bhj];
		    prod = a_elem * b_elem;
		    sum = sum + prod;
		}

		tmp1 = sum * alpha_i;
		c_elem = c_i[cij];
		tmp2 = c_elem * beta_i;
		tmp1 = tmp1 + tmp2;
		c_i[cij] = tmp1;
	    }
	}

    }

#if MDEBUG
    printf("m=%d, n=%d, k=%d\n", m, n, k);
    printf("lda=%d, ldb=%d, ldc=%d\n", lda, ldb, ldc);
    printf("\n");	  
    for(i=0; i<n*k; i++)  printf("%.1f ", *C1++); printf("\n");
#endif

}